

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O1

void __thiscall
CGL::RaytracedRenderer::save_image(RaytracedRenderer *this,string *filename,ImageBuffer *buffer)

{
  pointer pcVar1;
  int iVar2;
  tm *ptVar3;
  ostream *poVar4;
  time_t rawtime;
  time_t t;
  stringstream ss;
  uint local_208 [2];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  time_t local_1c0;
  uchar *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->state == DONE) {
    iVar2 = std::__cxx11::string::compare((char *)filename);
    if (iVar2 == 0) {
      time((time_t *)local_208);
      local_1c0 = time((time_t *)0x0);
      ptVar3 = localtime(&local_1c0);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->filename)._M_dataplus._M_p,
                          (this->filename)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_screenshot_",0xc);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,ptVar3->tm_mon + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,ptVar3->tm_mday);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,ptVar3->tm_hour);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,ptVar3->tm_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,ptVar3->tm_sec);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".png",4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)filename,(string *)local_1e0);
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0]);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    save_image();
    fprintf(_stderr,"[PathTracer] Saving to file: %s... ",(filename->_M_dataplus)._M_p);
    lodepng::encode(filename,local_1b8[0],local_208[0],(uint)local_1e0[0],LCT_RGBA,8);
    fwrite("Done!\n",6,1,_stderr);
    operator_delete__(local_1b8[0]);
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_200[0] = local_1f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_200,pcVar1,pcVar1 + filename->_M_string_length);
    (*(this->super_OfflineRenderer)._vptr_OfflineRenderer[0xf])(this,(string *)local_200);
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0]);
    }
  }
  return;
}

Assistant:

void RaytracedRenderer::save_image(string filename, ImageBuffer* buffer) {

  if (state != DONE) return;

  if (!buffer)
    buffer = &frameBuffer;

  if (filename == "") {
    time_t rawtime;
    time (&rawtime);

    time_t t = time(nullptr);
    tm *lt = localtime(&t);
    stringstream ss;
    ss << this->filename << "_screenshot_" << lt->tm_mon+1 << "-" << lt->tm_mday << "_" 
      << lt->tm_hour << "-" << lt->tm_min << "-" << lt->tm_sec << ".png";
    filename = ss.str();  
  }

  uint32_t* frame = &buffer->data[0];
  size_t w = buffer->w;
  size_t h = buffer->h;
  uint32_t* frame_out = new uint32_t[w * h];
  for(size_t i = 0; i < h; ++i) {
    memcpy(frame_out + i * w, frame + (h - i - 1) * w, 4 * w);
  }
  
  for (size_t i = 0; i < w * h; ++i) {
    frame_out[i] |= 0xFF000000;
  }

  fprintf(stderr, "[PathTracer] Saving to file: %s... ", filename.c_str());
  lodepng::encode(filename, (unsigned char*) frame_out, w, h);
  fprintf(stderr, "Done!\n");
  
  delete[] frame_out;

  save_sampling_rate_image(filename);
}